

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

int __thiscall cmComputeLinkDepends::ComputeComponentCount(cmComputeLinkDepends *this,NodeList *nl)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  LinkInterface *pLVar4;
  LinkInterface *iface;
  cmTarget *target;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator ni;
  int count;
  NodeList *nl_local;
  cmComputeLinkDepends *this_local;
  
  ni._M_current._4_4_ = 2;
  local_28._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        (&nl->super_vector<int,_std::allocator<int>_>);
  while( true ) {
    target = (cmTarget *)
             std::vector<int,_std::allocator<int>_>::end
                       (&nl->super_vector<int,_std::allocator<int>_>);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &target);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_28);
    pvVar3 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(long)*piVar2);
    if (((pvVar3->Target != (cmTarget *)0x0) &&
        (pLVar4 = cmTarget::GetLinkInterface(pvVar3->Target,&this->Config,this->Target),
        pLVar4 != (LinkInterface *)0x0)) && (ni._M_current._4_4_ < pLVar4->Multiplicity)) {
      ni._M_current._4_4_ = pLVar4->Multiplicity;
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  return ni._M_current._4_4_;
}

Assistant:

int cmComputeLinkDepends::ComputeComponentCount(NodeList const& nl)
{
  int count = 2;
  for(NodeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
    {
    if(cmTarget const* target = this->EntryList[*ni].Target)
      {
      if(cmTarget::LinkInterface const* iface =
         target->GetLinkInterface(this->Config, this->Target))
        {
        if(iface->Multiplicity > count)
          {
          count = iface->Multiplicity;
          }
        }
      }
    }
  return count;
}